

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

int anon_unknown.dwarf_16fac41::cmFileCommandCurlDebugCallback
              (CURL *param_1,curl_infotype type,char *chPtr,size_t size,void *data)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  char buf [128];
  char acStack_88 [128];
  
  if (type - CURLINFO_DATA_IN < 4) {
    uVar1 = snprintf(acStack_88,0x80,"[%lu bytes data]\n");
    if ((int)uVar1 < 1) {
      return 0;
    }
    pcVar2 = acStack_88 + uVar1;
    uVar3 = *(undefined8 *)((long)data + 8);
    chPtr = acStack_88;
  }
  else {
    if (CURLINFO_HEADER_OUT < type) {
      return 0;
    }
    pcVar2 = chPtr + size;
    uVar3 = *(undefined8 *)((long)data + 8);
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char*>
            ((vector<char,std::allocator<char>> *)data,uVar3,chPtr,pcVar2);
  return 0;
}

Assistant:

int cmFileCommandCurlDebugCallback(CURL*, curl_infotype type, char* chPtr,
                                   size_t size, void* data)
{
  cmFileCommandVectorOfChar& vec =
    *static_cast<cmFileCommandVectorOfChar*>(data);
  switch (type) {
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
    case CURLINFO_HEADER_OUT:
      cm::append(vec, chPtr, chPtr + size);
      break;
    case CURLINFO_DATA_IN:
    case CURLINFO_DATA_OUT:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT: {
      char buf[128];
      int n =
        snprintf(buf, sizeof(buf), "[%" KWIML_INT_PRIu64 " bytes data]\n",
                 static_cast<KWIML_INT_uint64_t>(size));
      if (n > 0) {
        cm::append(vec, buf, buf + n);
      }
    } break;
    default:
      break;
  }
  return 0;
}